

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopDfs.c
# Opt level: O3

void Hop_Remap_rec(Hop_Man_t *p,Hop_Obj_t *pObj)

{
  ulong *puVar1;
  Hop_Obj_t *p1;
  Hop_Obj_t *pHVar2;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/hop/hopDfs.c"
                  ,0x1f1,"void Hop_Remap_rec(Hop_Man_t *, Hop_Obj_t *)");
  }
  if ((*(uint *)&pObj->field_0x20 & 0x16) == 4) {
    Hop_Remap_rec(p,(Hop_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
    Hop_Remap_rec(p,(Hop_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
    puVar1 = (ulong *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
    if (puVar1 == (ulong *)0x0) {
      pHVar2 = (Hop_Obj_t *)0x0;
    }
    else {
      pHVar2 = (Hop_Obj_t *)((ulong)((uint)pObj->pFanin0 & 1) ^ *puVar1);
    }
    puVar1 = (ulong *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
    if (puVar1 == (ulong *)0x0) {
      p1 = (Hop_Obj_t *)0x0;
    }
    else {
      p1 = (Hop_Obj_t *)((ulong)((uint)pObj->pFanin1 & 1) ^ *puVar1);
    }
    pHVar2 = Hop_And(p,pHVar2,p1);
    (pObj->field_0).pData = pHVar2;
    if ((*(uint *)&pObj->field_0x20 & 0x10) != 0) {
      __assert_fail("!Hop_ObjIsMarkA(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/hop/hopDfs.c"
                    ,0x1f7,"void Hop_Remap_rec(Hop_Man_t *, Hop_Obj_t *)");
    }
    *(uint *)&pObj->field_0x20 = *(uint *)&pObj->field_0x20 | 0x10;
  }
  return;
}

Assistant:

void Hop_Remap_rec( Hop_Man_t * p, Hop_Obj_t * pObj )
{
    assert( !Hop_IsComplement(pObj) );
    if ( !Hop_ObjIsNode(pObj) || Hop_ObjIsMarkA(pObj) )
        return;
    Hop_Remap_rec( p, Hop_ObjFanin0(pObj) ); 
    Hop_Remap_rec( p, Hop_ObjFanin1(pObj) );
    pObj->pData = Hop_And( p, Hop_ObjChild0Copy(pObj), Hop_ObjChild1Copy(pObj) );
    assert( !Hop_ObjIsMarkA(pObj) ); // loop detection
    Hop_ObjSetMarkA( pObj );
}